

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O0

int Secp256K1::hexValue(char hex_digit)

{
  int iVar1;
  invalid_argument *this;
  int local_c;
  char hex_digit_local;
  
  iVar1 = (int)hex_digit;
  if (iVar1 - 0x30U < 10) {
    local_c = hex_digit + -0x30;
  }
  else if (iVar1 - 0x41U < 6) {
    local_c = hex_digit + -0x37;
  }
  else {
    if (5 < iVar1 - 0x61U) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"bad hex_digit");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_c = hex_digit + -0x57;
  }
  return local_c;
}

Assistant:

int Secp256K1::hexValue(char hex_digit)
{
    switch (hex_digit) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
        return hex_digit - '0';

    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
        return hex_digit - 'A' + 10;

    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
        return hex_digit - 'a' + 10;
    }
    throw std::invalid_argument("bad hex_digit");
}